

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O1

visplane_t *
swrenderer::R_FindPlane
          (secplane_t *height,FTextureID picnum,int lightlevel,double Alpha,bool additive,
          FTransform *xxform,int sky,FSectorPortal *portal)

{
  double dVar1;
  bool bVar2;
  visplane_t *pvVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  uint hash;
  DAngle *pDVar7;
  FSectorPortal *pFVar8;
  DAngle *pDVar9;
  double *pdVar10;
  bool bVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  int local_d4;
  double *local_c8;
  double *local_c0;
  double *local_b8;
  FTransform local_68;
  
  iVar6 = SUB84(Alpha + 103079215104.0,0);
  if (skyflatnum.texnum == picnum.texnum) {
    pdVar10 = &local_68.yOffs;
    local_b8 = &local_68.baseyOffs;
    local_c0 = &local_68.xScale;
    local_c8 = &local_68.yScale;
    pDVar7 = &local_68.Angle;
    pDVar9 = &local_68.baseAngle;
    local_68.xOffs = 0.0;
    local_68.yOffs = 0.0;
    local_68.baseyOffs = 0.0;
    local_68.yScale = 1.0;
    local_68.xScale = 1.0;
    local_68.Angle.Degrees = 0.0;
    local_68.baseAngle.Degrees = 0.0;
    dVar12 = (height->normal).Z;
    dVar13 = -1.0 / dVar12;
    xxform = &local_68;
    dVar14 = 0.0;
    if (portal != (FSectorPortal *)0x0) {
      bVar11 = (portal->mFlags & 2) == 0;
      additive = false;
      dVar16 = 0.0;
      dVar15 = 0.0;
      local_d4 = 0;
      goto LAB_002e088b;
    }
    additive = false;
    dVar16 = 0.0;
    dVar15 = 0.0;
    local_d4 = 0;
  }
  else {
    pdVar10 = &xxform->yOffs;
    local_b8 = &xxform->baseyOffs;
    local_c0 = &xxform->xScale;
    local_c8 = &xxform->yScale;
    pDVar7 = &xxform->Angle;
    pDVar9 = &xxform->baseAngle;
    local_d4 = lightlevel;
    if ((portal != (FSectorPortal *)0x0) && ((portal->mFlags & 2) == 0)) {
      dVar12 = (height->normal).Z;
      dVar15 = (height->normal).X;
      dVar16 = (height->normal).Y;
      dVar14 = height->D;
      dVar13 = height->negiC;
      bVar11 = true;
      goto LAB_002e088b;
    }
    dVar12 = (height->normal).Z;
    dVar15 = (height->normal).X;
    dVar16 = (height->normal).Y;
    dVar14 = height->D;
    dVar13 = height->negiC;
    portal = (FSectorPortal *)0x0;
    pFVar8 = (FSectorPortal *)(ulong)(fakeAlpha | 0x80000000);
    if (((byte)fake3D & 3) == 0) {
      pFVar8 = portal;
    }
    sky = (int)pFVar8;
    iVar6 = 0x10000;
  }
  bVar11 = false;
LAB_002e088b:
  hash = 0x80;
  if (!bVar11) {
    hash = SUB84(height->D + 103079215104.0,0) * 7 + picnum.texnum * 3 + local_d4 & 0x7f;
  }
  pvVar3 = (visplane_t *)(&visplanes)[hash];
  do {
    if (pvVar3 == (visplane_t *)0x0) {
      pvVar3 = new_visplane(hash);
      (pvVar3->height).normal.Z = dVar12;
      (pvVar3->height).normal.Y = dVar16;
      (pvVar3->height).normal.X = dVar15;
      (pvVar3->height).D = dVar14;
      (pvVar3->height).negiC = dVar13;
      (pvVar3->picnum).texnum = picnum.texnum;
      pvVar3->lightlevel = local_d4;
      dVar12 = xxform->yOffs;
      dVar15 = xxform->baseyOffs;
      dVar16 = xxform->xScale;
      (pvVar3->xform).xOffs = xxform->xOffs;
      (pvVar3->xform).yOffs = dVar12;
      (pvVar3->xform).baseyOffs = dVar15;
      (pvVar3->xform).xScale = dVar16;
      (pvVar3->xform).yScale = xxform->yScale;
      (pvVar3->xform).Angle.Degrees = pDVar7->Degrees;
      (pvVar3->xform).baseAngle.Degrees = pDVar9->Degrees;
      pvVar3->colormap = basecolormap;
      pvVar3->sky = sky;
      pvVar3->portal = portal;
      uVar4 = (ulong)(uint)viewwidth;
      pvVar3->left = viewwidth;
      pvVar3->right = 0;
      pvVar3->extralight = stacked_extralight;
      pvVar3->visibility = stacked_visibility;
      (pvVar3->viewpos).Z = DAT_01788570;
      (pvVar3->viewpos).Y = _DAT_01788568;
      (pvVar3->viewpos).X = stacked_viewpos;
      (pvVar3->viewangle).Degrees = stacked_angle;
      pvVar3->Alpha = iVar6;
      pvVar3->Additive = additive;
      pvVar3->CurrentPortalUniq = CurrentPortalUniq;
      pvVar3->MirrorFlags = (uint)_MirrorFlags;
      pvVar3->CurrentSkybox = CurrentSkybox;
      if (uVar4 != 0) {
        uVar5 = 0;
        do {
          *(undefined2 *)(&pvVar3->field_0xda + uVar5 * 2) = 0x7fff;
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
      return pvVar3;
    }
    if (bVar11) {
      if (portal == pvVar3->portal) {
        dVar1 = (pvVar3->height).normal.X;
        if ((dVar15 == dVar1) && (dVar16 == (pvVar3->height).normal.Y)) {
          bVar2 = dVar12 == (pvVar3->height).normal.Z;
        }
        else {
          bVar2 = false;
        }
        if ((bVar2) && (dVar14 == (pvVar3->height).D)) {
          if (portal->mType == 0) {
            return pvVar3;
          }
          if ((((pvVar3->extralight == stacked_extralight) &&
               (pvVar3->visibility == stacked_visibility)) &&
              ((pvVar3->viewpos).X == stacked_viewpos)) &&
             (((pvVar3->viewpos).Y == _DAT_01788568 && ((pvVar3->viewpos).Z == DAT_01788570)))) {
            if (portal->mType != 1) {
              return pvVar3;
            }
            if ((((pvVar3->Alpha == iVar6) && (pvVar3->Additive == additive)) &&
                ((iVar6 == 0 ||
                 ((((dVar15 == dVar1 && (dVar16 == (pvVar3->height).normal.Y)) &&
                   (dVar12 == (pvVar3->height).normal.Z)) &&
                  ((((pvVar3->picnum).texnum == picnum.texnum && (local_d4 == pvVar3->lightlevel))
                   && ((basecolormap == pvVar3->colormap &&
                       (bVar2 = FTransform::operator==(xxform,&pvVar3->xform), bVar2)))))))))) &&
               ((pvVar3->viewangle).Degrees == stacked_angle)) {
              return pvVar3;
            }
          }
        }
      }
    }
    else {
      if ((dVar15 == (pvVar3->height).normal.X) && (dVar16 == (pvVar3->height).normal.Y)) {
        bVar2 = dVar12 == (pvVar3->height).normal.Z;
      }
      else {
        bVar2 = false;
      }
      if (((((bVar2) && (dVar14 == (pvVar3->height).D)) &&
           ((pvVar3->picnum).texnum == picnum.texnum)) &&
          (((((local_d4 == pvVar3->lightlevel && (basecolormap == pvVar3->colormap)) &&
             ((xxform->xOffs == (pvVar3->xform).xOffs &&
              ((*local_b8 + *pdVar10 == (pvVar3->xform).baseyOffs + (pvVar3->xform).yOffs &&
               (*local_c0 == (pvVar3->xform).xScale)))))) && (*local_c8 == (pvVar3->xform).yScale))
           && (((((pDVar7->Degrees + pDVar9->Degrees ==
                   (pvVar3->xform).Angle.Degrees + (pvVar3->xform).baseAngle.Degrees &&
                  (sky == pvVar3->sky)) && (CurrentPortalUniq == pvVar3->CurrentPortalUniq)) &&
                ((pvVar3->MirrorFlags == (uint)_MirrorFlags &&
                 (CurrentSkybox == pvVar3->CurrentSkybox)))) && (ViewPos.X == (pvVar3->viewpos).X)))
           ))) && ((ViewPos.Y == (pvVar3->viewpos).Y && (ViewPos.Z == (pvVar3->viewpos).Z)))) {
        return pvVar3;
      }
    }
    pvVar3 = pvVar3->next;
  } while( true );
}

Assistant:

visplane_t *R_FindPlane (const secplane_t &height, FTextureID picnum, int lightlevel, double Alpha, bool additive,
						const FTransform &xxform,
						 int sky, FSectorPortal *portal)
{
	secplane_t plane;
	visplane_t *check;
	unsigned hash;						// killough
	bool isskybox;
	const FTransform *xform = &xxform;
	fixed_t alpha = FLOAT2FIXED(Alpha);
	//angle_t angle = (xform.Angle + xform.baseAngle).BAMs();

	FTransform nulltransform;

	if (picnum == skyflatnum)	// killough 10/98
	{ // most skies map together
		lightlevel = 0;
		xform = &nulltransform;
		nulltransform.xOffs = nulltransform.yOffs = nulltransform.baseyOffs = 0;
		nulltransform.xScale = nulltransform.yScale = 1;
		nulltransform.Angle = nulltransform.baseAngle = 0.0;
		additive = false;
		// [RH] Map floor skies and ceiling skies to separate visplanes. This isn't
		// always necessary, but it is needed if a floor and ceiling sky are in the
		// same column but separated by a wall. If they both try to reside in the
		// same visplane, then only the floor sky will be drawn.
		plane.set(0., 0., height.fC(), 0.);
		isskybox = portal != NULL && !(portal->mFlags & PORTSF_INSKYBOX);
	}
	else if (portal != NULL && !(portal->mFlags & PORTSF_INSKYBOX))
	{
		plane = height;
		isskybox = true;
	}
	else
	{
		plane = height;
		isskybox = false;
		// kg3D - hack, store alpha in sky
		// i know there is ->alpha, but this also allows to identify fake plane
		// and ->alpha is for stacked sectors
		if (fake3D & (FAKE3D_FAKEFLOOR|FAKE3D_FAKECEILING)) sky = 0x80000000 | fakeAlpha;
		else sky = 0;	// not skyflatnum so it can't be a sky
		portal = NULL;
		alpha = OPAQUE;
	}

	// New visplane algorithm uses hash table -- killough
	hash = isskybox ? MAXVISPLANES : visplane_hash (picnum.GetIndex(), lightlevel, height);

	for (check = visplanes[hash]; check; check = check->next)	// killough
	{
		if (isskybox)
		{
			if (portal == check->portal && plane == check->height)
			{
				if (portal->mType != PORTS_SKYVIEWPOINT)
				{ // This skybox is really a stacked sector, so we need to
				  // check even more.
					if (check->extralight == stacked_extralight &&
						check->visibility == stacked_visibility &&
						check->viewpos == stacked_viewpos &&
						(
							// headache inducing logic... :(
							(portal->mType != PORTS_STACKEDSECTORTHING) ||
							(
								check->Alpha == alpha &&
								check->Additive == additive &&
								(alpha == 0 ||	// if alpha is > 0 everything needs to be checked
									(plane == check->height &&
									 picnum == check->picnum &&
									 lightlevel == check->lightlevel &&
									 basecolormap == check->colormap &&	// [RH] Add more checks
									 *xform == check->xform
									)
								) &&
								check->viewangle == stacked_angle
							)
						)
					   )
					{
						return check;
					}
				}
				else
				{
					return check;
				}
			}
		}
		else
		if (plane == check->height &&
			picnum == check->picnum &&
			lightlevel == check->lightlevel &&
			basecolormap == check->colormap &&	// [RH] Add more checks
			*xform == check->xform &&
			sky == check->sky &&
			CurrentPortalUniq == check->CurrentPortalUniq &&
			MirrorFlags == check->MirrorFlags &&
			CurrentSkybox == check->CurrentSkybox &&
			ViewPos == check->viewpos
			)
		{
		  return check;
		}
	}

	check = new_visplane (hash);		// killough

	check->height = plane;
	check->picnum = picnum;
	check->lightlevel = lightlevel;
	check->xform = *xform;
	check->colormap = basecolormap;		// [RH] Save colormap
	check->sky = sky;
	check->portal = portal;
	check->left = viewwidth;			// Was SCREENWIDTH -- killough 11/98
	check->right = 0;
	check->extralight = stacked_extralight;
	check->visibility = stacked_visibility;
	check->viewpos = stacked_viewpos;
	check->viewangle = stacked_angle;
	check->Alpha = alpha;
	check->Additive = additive;
	check->CurrentPortalUniq = CurrentPortalUniq;
	check->MirrorFlags = MirrorFlags;
	check->CurrentSkybox = CurrentSkybox;

	fillshort (check->top, viewwidth, 0x7fff);

	return check;
}